

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O2

ssize_t __thiscall DistanceGraph::read(DistanceGraph *this,int __fd,void *__buf,size_t __nbytes)

{
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  ifstream *ifs;
  uint64_t s;
  
  ifs = (ifstream *)CONCAT44(in_register_00000034,__fd);
  std::istream::read((char *)ifs,(long)&s);
  std::__cxx11::string::resize((ulong)&this->name);
  std::istream::read((char *)ifs,(long)(this->name)._M_dataplus._M_p);
  sdglib::read_flat_vectorvector<Link>(ifs,&this->links);
  return extraout_RAX;
}

Assistant:

void DistanceGraph::read(std::ifstream &input_file) {
    uint64_t s;
    input_file.read((char *) &s, sizeof(s));
    name.resize(s);
    input_file.read((char *) name.data(), name.size());
    sdglib::read_flat_vectorvector(input_file, links);
}